

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseIncoming.cpp
# Opt level: O3

Result __thiscall
tonk::SessionIncoming::onSiameseSolved(SessionIncoming *this,SiameseOriginalPacket *packet)

{
  ushort uVar1;
  uint uVar2;
  long lVar3;
  RefCounter *pRVar4;
  long in_RDX;
  Result *success;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  undefined1 *local_50;
  long local_48;
  undefined1 local_40 [16];
  
  uVar2 = *(uint *)(in_RDX + 4);
  uVar5 = 0;
  if (1 < uVar2) {
    lVar3 = *(long *)(in_RDX + 8);
    uVar7 = 0;
    do {
      uVar1 = *(ushort *)(lVar3 + uVar7);
      iVar6 = (int)uVar7 + 2;
      uVar5 = uVar1 & 0x7ff;
      if (uVar2 - iVar6 < uVar5) {
        local_50 = local_40;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Truncated message","");
        pRVar4 = (RefCounter *)operator_new(0x38);
        *(char **)pRVar4 = "SessionIncoming::onSiameseSolved";
        (pRVar4->ShutdownJson)._M_dataplus._M_p = (pointer)&(pRVar4->ShutdownJson).field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&pRVar4->ShutdownJson,local_50,local_50 + local_48);
        goto LAB_0014906d;
      }
      uVar1 = uVar1 >> 0xb;
      if ((uVar1 == 0x1f) || (uVar1 == 3)) {
        deliverMessage(this,(uint)packet,(uint8_t *)(ulong)uVar1,iVar6 + (int)lVar3);
        if ((this->Deps).ConnectionRef != (RefCounter *)0x0) {
          return (Result)(ErrorResult *)this;
        }
        Result::~Result((Result *)this);
      }
      uVar5 = iVar6 + uVar5;
      uVar7 = (ulong)uVar5;
    } while (1 < uVar2 - uVar5);
  }
  if (uVar2 == uVar5) {
    (this->Deps).ConnectionRef = (RefCounter *)0x0;
  }
  else {
    local_50 = local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Invalid frame","");
    pRVar4 = (RefCounter *)operator_new(0x38);
    *(char **)pRVar4 = "SessionIncoming::onSiameseSolved";
    (pRVar4->ShutdownJson)._M_dataplus._M_p = (pointer)&(pRVar4->ShutdownJson).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pRVar4->ShutdownJson,local_50,local_50 + local_48);
LAB_0014906d:
    (pRVar4->RefCount).super___atomic_base<int>._M_i = 0;
    (pRVar4->ShutdownLock).super___mutex_base._M_mutex.__align = 9;
    (this->Deps).ConnectionRef = pRVar4;
    if (local_50 != local_40) {
      operator_delete(local_50);
    }
  }
  return (Result)(ErrorResult *)this;
}

Assistant:

Result SessionIncoming::onSiameseSolved(const SiameseOriginalPacket& packet)
{
    siamese::ReadByteStream frameReader(packet.Data, packet.DataBytes);

    // Process all messages contained in the datagram:
    while (frameReader.Remaining() >= protocol::kMessageFrameBytes)
    {
        // Read message frame header
        unsigned messageType = frameReader.Read16();
        const unsigned messageBytes = messageType & protocol::kMessageLengthMask;

        if (frameReader.Remaining() < messageBytes)
        {
            TONK_DEBUG_BREAK();
            return Result("SessionIncoming::onSiameseSolved", "Truncated message", ErrorType::Tonk, Tonk_InvalidData);
        }

        messageType >>= protocol::kMessageLengthBits;
        const uint8_t* messageData = frameReader.Read(messageBytes);

        // Unordered and unreliable data can be processed after Siamese solves
        // the recovery problem
        if (messageType == protocol::MessageType_Unordered ||
            messageType == protocol::MessageType_Unreliable)
        {
            TONK_VERBOSE_INCOMING_LOG("Deliver onSiameseSolved unordered(", packet.PacketNum, ") message: messageType=", messageType, " messageBytes=", messageBytes);

            const Result result = deliverMessage(messageType, messageData, messageBytes);
            if (result.IsFail()) {
                return result;
            }
        }
    }

    // If the message payload was not completely used:
    if (frameReader.Remaining() > 0)
    {
        TONK_DEBUG_BREAK(); // Invalid data
        return Result("SessionIncoming::onSiameseSolved", "Invalid frame", ErrorType::Tonk, Tonk_InvalidData);
    }

    return Result::Success();
}